

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void prf_messages_exit(void)

{
  int iVar1;
  int count;
  int i;
  int local_4;
  
  iVar1 = prf_array_count((void *)0x11641d);
  for (local_4 = 0; local_4 < iVar1; local_4 = local_4 + 1) {
    if (prf_handlers[1][local_4] != (prf_msg_handler_t *)0x0) {
      free(prf_handlers[1][local_4]);
    }
  }
  prf_array_free((void *)0x116474);
  iVar1 = prf_array_count((void *)0x116480);
  for (local_4 = 0; local_4 < iVar1; local_4 = local_4 + 1) {
    if (prf_handlers[2][local_4] != (prf_msg_handler_t *)0x0) {
      free(prf_handlers[2][local_4]);
    }
  }
  prf_array_free((void *)0x1164d7);
  iVar1 = prf_array_count((void *)0x1164e3);
  for (local_4 = 0; local_4 < iVar1; local_4 = local_4 + 1) {
    if (prf_handlers[3][local_4] != (prf_msg_handler_t *)0x0) {
      free(prf_handlers[3][local_4]);
    }
  }
  prf_array_free((void *)0x11653a);
  iVar1 = prf_array_count((void *)0x116546);
  for (local_4 = 0; local_4 < iVar1; local_4 = local_4 + 1) {
    if (prf_handlers[4][local_4] != (prf_msg_handler_t *)0x0) {
      free(prf_handlers[4][local_4]);
    }
  }
  prf_array_free((void *)0x11659d);
  iVar1 = prf_array_count((void *)0x1165a9);
  for (local_4 = 0; local_4 < iVar1; local_4 = local_4 + 1) {
    if (prf_handlers[5][local_4] != (prf_msg_handler_t *)0x0) {
      free(prf_handlers[5][local_4]);
    }
  }
  prf_array_free((void *)0x116600);
  return;
}

Assistant:

void
prf_messages_exit(
    void )
{
    int i, count;

    count = prf_array_count( prf_handlers[ PRF_MSG_INFO ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_INFO ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_INFO ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_INFO ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_DEBUG ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_DEBUG ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_DEBUG ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_DEBUG ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_WARNING ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_WARNING ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_WARNING ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_WARNING ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_ERROR ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_ERROR ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_ERROR ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_ERROR ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_FATAL_ERROR ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_FATAL_ERROR ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_FATAL_ERROR ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_FATAL_ERROR ] );
}